

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

htsFile * hts_hopen(hFILE *hfile,char *fn,char *mode)

{
  htsExactFormat hVar1;
  uint uVar2;
  int iVar3;
  htsFormatCategory hVar4;
  htsFile *__ptr;
  char *pcVar5;
  BGZF *pBVar6;
  cram_fd *pcVar7;
  BGZF *gzfp;
  htsFormat *fmt;
  htsFile *fp;
  char *mode_local;
  char *fn_local;
  hFILE *hfile_local;
  
  __ptr = (htsFile *)calloc(1,0x60);
  if (__ptr == (htsFile *)0x0) goto LAB_0010d00f;
  pcVar5 = strdup(fn);
  __ptr->fn = pcVar5;
  uVar2 = ed_is_big();
  *(uint *)&__ptr->field_0x0 = *(uint *)&__ptr->field_0x0 & 0xfffffffb | (uVar2 & 1) << 2;
  pcVar5 = strchr(mode,0x72);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strchr(mode,0x77);
    if ((pcVar5 == (char *)0x0) && (pcVar5 = strchr(mode,0x61), pcVar5 == (char *)0x0))
    goto LAB_0010d00f;
    *(uint *)&__ptr->field_0x0 = *(uint *)&__ptr->field_0x0 & 0xfffffffd | 2;
    pcVar5 = strchr(mode,0x62);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strchr(mode,99);
      if (pcVar5 == (char *)0x0) {
        (__ptr->format).format = text_format;
      }
      else {
        (__ptr->format).format = cram;
      }
    }
    else {
      (__ptr->format).format = binary_format;
    }
    pcVar5 = strchr(mode,0x7a);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strchr(mode,0x67);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = strchr(mode,0x75);
        if (pcVar5 == (char *)0x0) {
          hVar1 = (__ptr->format).format;
          if (hVar1 == binary_format) {
            (__ptr->format).compression = bgzf;
          }
          else if (hVar1 == text_format) {
            (__ptr->format).compression = no_compression;
          }
          else {
            if (hVar1 != cram) {
              abort();
            }
            (__ptr->format).compression = custom;
          }
        }
        else {
          (__ptr->format).compression = no_compression;
        }
      }
      else {
        (__ptr->format).compression = gzip;
      }
    }
    else {
      (__ptr->format).compression = bgzf;
    }
    hVar4 = format_category((__ptr->format).format);
    (__ptr->format).category = hVar4;
    (__ptr->format).version.minor = -1;
    (__ptr->format).version.major = -1;
    (__ptr->format).compression_level = -1;
    (__ptr->format).specific = (void *)0x0;
  }
  else {
    iVar3 = hts_detect_format(hfile,&__ptr->format);
    if (iVar3 < 0) goto LAB_0010d00f;
  }
  hVar1 = (__ptr->format).format;
  if (hVar1 != binary_format) {
    if (hVar1 - text_format < 2) {
LAB_0010cf80:
      if ((*(uint *)&__ptr->field_0x0 >> 1 & 1) == 0) {
        pBVar6 = bgzf_hopen(hfile,mode);
        if (pBVar6 != (BGZF *)0x0) {
          pBVar6 = (BGZF *)ks_init(pBVar6);
          (__ptr->fp).bgzf = pBVar6;
          return __ptr;
        }
      }
      else {
        if ((__ptr->format).compression == no_compression) {
          (__ptr->fp).hfile = hfile;
          return __ptr;
        }
        pBVar6 = bgzf_hopen(hfile,mode);
        (__ptr->fp).bgzf = pBVar6;
        if ((__ptr->fp).bgzf != (BGZF *)0x0) {
          return __ptr;
        }
      }
      goto LAB_0010d00f;
    }
    if (hVar1 != bam) {
      if (hVar1 == cram) {
        pcVar7 = cram_dopen(hfile,fn,mode);
        (__ptr->fp).cram = pcVar7;
        if ((__ptr->fp).bgzf != (BGZF *)0x0) {
          if ((*(uint *)&__ptr->field_0x0 >> 1 & 1) == 0) {
            cram_set_option((__ptr->fp).cram,CRAM_OPT_DECODE_MD,1);
          }
          *(uint *)&__ptr->field_0x0 = *(uint *)&__ptr->field_0x0 & 0xfffffff7 | 8;
          return __ptr;
        }
        goto LAB_0010d00f;
      }
      if (hVar1 == vcf) goto LAB_0010cf80;
      if (hVar1 != bcf) goto LAB_0010d00f;
    }
  }
  pBVar6 = bgzf_hopen(hfile,mode);
  (__ptr->fp).bgzf = pBVar6;
  if ((__ptr->fp).bgzf != (BGZF *)0x0) {
    *(uint *)&__ptr->field_0x0 = *(uint *)&__ptr->field_0x0 & 0xfffffffe | 1;
    return __ptr;
  }
LAB_0010d00f:
  if (1 < hts_verbose) {
    fprintf(_stderr,"[E::%s] fail to open file \'%s\'\n","hts_hopen",fn);
  }
  if (__ptr != (htsFile *)0x0) {
    free(__ptr->fn);
    free(__ptr->fn_aux);
    free(__ptr);
  }
  return (htsFile *)0x0;
}

Assistant:

htsFile *hts_hopen(struct hFILE *hfile, const char *fn, const char *mode)
{
    htsFile *fp = (htsFile*)calloc(1, sizeof(htsFile));
    if (fp == NULL) goto error;

    fp->fn = strdup(fn);
    fp->is_be = ed_is_big();

    if (strchr(mode, 'r')) {
        if (hts_detect_format(hfile, &fp->format) < 0) goto error;
    }
    else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        htsFormat *fmt = &fp->format;
        fp->is_write = 1;

        if (strchr(mode, 'b')) fmt->format = binary_format;
        else if (strchr(mode, 'c')) fmt->format = cram;
        else fmt->format = text_format;

        if (strchr(mode, 'z')) fmt->compression = bgzf;
        else if (strchr(mode, 'g')) fmt->compression = gzip;
        else if (strchr(mode, 'u')) fmt->compression = no_compression;
        else {
            // No compression mode specified, set to the default for the format
            switch (fmt->format) {
            case binary_format: fmt->compression = bgzf; break;
            case cram: fmt->compression = custom; break;
            case text_format: fmt->compression = no_compression; break;
            default: abort();
            }
        }

        // Fill in category (if determinable; e.g. 'b' could be BAM or BCF)
        fmt->category = format_category(fmt->format);

        fmt->version.major = fmt->version.minor = -1;
        fmt->compression_level = -1;
        fmt->specific = NULL;
    }
    else goto error;

    switch (fp->format.format) {
    case binary_format:
    case bam:
    case bcf:
        fp->fp.bgzf = bgzf_hopen(hfile, mode);
        if (fp->fp.bgzf == NULL) goto error;
        fp->is_bin = 1;
        break;

    case cram:
        fp->fp.cram = cram_dopen(hfile, fn, mode);
        if (fp->fp.cram == NULL) goto error;
        if (!fp->is_write)
            cram_set_option(fp->fp.cram, CRAM_OPT_DECODE_MD, 1);
        fp->is_cram = 1;
        break;

    case text_format:
    case sam:
    case vcf:
        if (!fp->is_write) {
        #if KS_BGZF
            BGZF *gzfp = bgzf_hopen(hfile, mode);
        #else
            // TODO Implement gzip hFILE adaptor
            hclose(hfile); // This won't work, especially for stdin
            gzFile gzfp = strcmp(fn, "-")? gzopen(fn, "rb") : gzdopen(fileno(stdin), "rb");
        #endif
            if (gzfp) fp->fp.voidp = ks_init(gzfp);
            else goto error;
        }
        else if (fp->format.compression != no_compression) {
            fp->fp.bgzf = bgzf_hopen(hfile, mode);
            if (fp->fp.bgzf == NULL) goto error;
        }
        else
            fp->fp.hfile = hfile;
        break;

    default:
        goto error;
    }

    return fp;

error:
    if (hts_verbose >= 2)
        fprintf(stderr, "[E::%s] fail to open file '%s'\n", __func__, fn);

    if (fp) {
        free(fp->fn);
        free(fp->fn_aux);
        free(fp);
    }
    return NULL;
}